

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O0

void CTestGen12dGPUResource::SetUpTestCase(void)

{
  printf("%s\n");
  CommonULT::GfxPlatform.eProductFamily = IGFX_XE_HP_SDV;
  CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_XE_HP_CORE;
  CommonULT::pGfxAdapterInfo = (ADAPTER_INFO *)malloc(0x9bf);
  if (CommonULT::pGfxAdapterInfo != (ADAPTER_INFO *)0x0) {
    memset(CommonULT::pGfxAdapterInfo,0,0x9bf);
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xfffffffffffbffff | 0x40000);
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xffffffffffff7fff | 0x8000);
    *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 =
         *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0xffbf | 0x40;
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xfffffffeffffffff | 0x100000000);
    CommonULT::SetUpTestCase();
  }
  return;
}

Assistant:

void CTestGen12dGPUResource::SetUpTestCase()
{
    printf("%s\n", __FUNCTION__);
    GfxPlatform.eProductFamily    = IGFX_XE_HP_SDV;
    GfxPlatform.eRenderCoreFamily = IGFX_XE_HP_CORE;

    pGfxAdapterInfo = (ADAPTER_INFO *)malloc(sizeof(ADAPTER_INFO));
    if(pGfxAdapterInfo)
    {
        memset(pGfxAdapterInfo, 0, sizeof(ADAPTER_INFO));

        pGfxAdapterInfo->SkuTable.FtrLinearCCS             = 1; //legacy y =>0 - test both
        pGfxAdapterInfo->SkuTable.FtrStandardMipTailFormat = 1;
        pGfxAdapterInfo->SkuTable.FtrTileY                 = 1;
        pGfxAdapterInfo->SkuTable.FtrTile64Optimization    = 1;
	CommonULT::SetUpTestCase();
    }
}